

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O0

EntityExpRes __thiscall
xercesc_4_0::SGXMLScanner::scanEntityRef
          (SGXMLScanner *this,bool param_1,XMLCh *firstCh,XMLCh *secondCh,bool *escaped)

{
  ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher> *pVVar1;
  XMLBufferMgr *pXVar2;
  bool bVar3;
  XMLBuffer *toFill;
  XMLCh *pXVar4;
  XMLBufferMgr *pXVar5;
  ulong uVar6;
  char16_t *pcVar7;
  XMLCh local_a8 [4];
  XMLCh expLimStr [32];
  int local_54;
  undefined1 local_50 [4];
  int colonPosition;
  XMLBufBid bbName;
  XMLSize_t curReader;
  bool *escaped_local;
  XMLCh *secondCh_local;
  XMLCh *firstCh_local;
  bool param_1_local;
  SGXMLScanner *this_local;
  
  *secondCh = L'\0';
  *escaped = false;
  bbName.fMgr = (XMLBufferMgr *)ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr)
  ;
  bVar3 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L'#');
  if (bVar3) {
    bVar3 = XMLScanner::scanCharRef(&this->super_XMLScanner,firstCh,secondCh);
    pXVar2 = bbName.fMgr;
    if (bVar3) {
      *escaped = true;
      pXVar5 = (XMLBufferMgr *)ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
      if (pXVar2 != pXVar5) {
        XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
      }
      this_local._4_4_ = EntityExp_Returned;
    }
    else {
      this_local._4_4_ = EntityExp_Failed;
    }
  }
  else {
    XMLBufBid::XMLBufBid((XMLBufBid *)local_50,&(this->super_XMLScanner).fBufMgr);
    toFill = XMLBufBid::getBuffer((XMLBufBid *)local_50);
    bVar3 = ReaderMgr::getQName(&(this->super_XMLScanner).fReaderMgr,toFill,&local_54);
    if (bVar3) {
      bVar3 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L';');
      if (!bVar3) {
        pXVar4 = XMLBufBid::getRawBuffer((XMLBufBid *)local_50);
        XMLScanner::emitError
                  (&this->super_XMLScanner,UnterminatedEntityRef,pXVar4,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      pXVar2 = bbName.fMgr;
      pXVar5 = (XMLBufferMgr *)ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
      if (pXVar2 != pXVar5) {
        XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
      }
      pVVar1 = this->fEntityTable;
      pXVar4 = XMLBufBid::getRawBuffer((XMLBufBid *)local_50);
      bVar3 = ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::containsKey(pVVar1,pXVar4);
      if (bVar3) {
        if ((this->super_XMLScanner).fSecurityManager != (SecurityManager *)0x0) {
          uVar6 = (this->super_XMLScanner).fEntityExpansionCount + 1;
          (this->super_XMLScanner).fEntityExpansionCount = uVar6;
          if ((this->super_XMLScanner).fEntityExpansionLimit < uVar6) {
            XMLString::sizeToText
                      ((this->super_XMLScanner).fEntityExpansionLimit,local_a8,0x1f,10,
                       (this->super_XMLScanner).fMemoryManager);
            XMLScanner::emitError
                      (&this->super_XMLScanner,EntityExpansionLimitExceeded,local_a8,(XMLCh *)0x0,
                       (XMLCh *)0x0,(XMLCh *)0x0);
            (this->super_XMLScanner).fEntityExpansionCount = 0;
          }
        }
        pVVar1 = this->fEntityTable;
        pXVar4 = XMLBufBid::getRawBuffer((XMLBufBid *)local_50);
        pcVar7 = ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get
                           (pVVar1,pXVar4,XMLPlatformUtils::fgMemoryManager);
        *firstCh = *pcVar7;
        *escaped = true;
        this_local._4_4_ = EntityExp_Returned;
      }
      else {
        if ((((this->super_XMLScanner).fStandalone & 1U) != 0) ||
           (((this->super_XMLScanner).fHasNoDTD & 1U) != 0)) {
          pXVar4 = XMLBufBid::getRawBuffer((XMLBufBid *)local_50);
          XMLScanner::emitError
                    (&this->super_XMLScanner,EntityNotFound,pXVar4,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        this_local._4_4_ = EntityExp_Failed;
      }
    }
    else {
      bVar3 = XMLBufBid::isEmpty((XMLBufBid *)local_50);
      if (bVar3) {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedEntityRefName);
      }
      else {
        pXVar4 = XMLBufBid::getRawBuffer((XMLBufBid *)local_50);
        XMLScanner::emitError
                  (&this->super_XMLScanner,InvalidEntityRefName,pXVar4,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      this_local._4_4_ = EntityExp_Failed;
    }
    expLimStr[0x1c] = L'\x01';
    expLimStr[0x1d] = L'\0';
    XMLBufBid::~XMLBufBid((XMLBufBid *)local_50);
  }
  return this_local._4_4_;
}

Assistant:

SGXMLScanner::EntityExpRes
SGXMLScanner::scanEntityRef(  const   bool
                            ,       XMLCh&  firstCh
                            ,       XMLCh&  secondCh
                            ,       bool&   escaped)
{
    // Assume no escape
    secondCh = 0;
    escaped = false;

    // We have to insure that its all in one entity
    const XMLSize_t curReader = fReaderMgr.getCurrentReaderNum();

    //  If the next char is a pound, then its a character reference and we
    //  need to expand it always.
    if (fReaderMgr.skippedChar(chPound))
    {
        //  Its a character reference, so scan it and get back the numeric
        //  value it represents.
        if (!scanCharRef(firstCh, secondCh))
            return EntityExp_Failed;

        escaped = true;

        if (curReader != fReaderMgr.getCurrentReaderNum())
            emitError(XMLErrs::PartialMarkupInEntity);

        return EntityExp_Returned;
    }

    // Expand it since its a normal entity ref
    XMLBufBid bbName(&fBufMgr);
    int colonPosition;
    if (!fReaderMgr.getQName(bbName.getBuffer(), &colonPosition))
    {
        if (bbName.isEmpty())
            emitError(XMLErrs::ExpectedEntityRefName);
        else
            emitError(XMLErrs::InvalidEntityRefName, bbName.getRawBuffer());
        return EntityExp_Failed;
    }

    //  Next char must be a semi-colon. But if its not, just emit
    //  an error and try to continue.
    if (!fReaderMgr.skippedChar(chSemiColon))
        emitError(XMLErrs::UnterminatedEntityRef, bbName.getRawBuffer());

    // Make sure we ended up on the same entity reader as the & char
    if (curReader != fReaderMgr.getCurrentReaderNum())
        emitError(XMLErrs::PartialMarkupInEntity);

    // Look up the name in the general entity pool
    // If it does not exist, then obviously an error
    if (!fEntityTable->containsKey(bbName.getRawBuffer()))
    {
        // XML 1.0 Section 4.1
        // Well-formedness Constraint for entity not found:
        //   In a document without any DTD, a document with only an internal DTD subset which contains no parameter entity references,
        //      or a document with "standalone='yes'", for an entity reference that does not occur within the external subset
        //      or a parameter entity
        if (fStandalone || fHasNoDTD)
            emitError(XMLErrs::EntityNotFound, bbName.getRawBuffer());

        return EntityExp_Failed;
    }

    // here's where we need to check if there's a SecurityManager,
    // how many entity references we've had
    if(fSecurityManager != 0 && ++fEntityExpansionCount > fEntityExpansionLimit) {
        XMLCh expLimStr[32];
        XMLString::sizeToText(fEntityExpansionLimit, expLimStr, 31, 10, fMemoryManager);
        emitError
        (
            XMLErrs::EntityExpansionLimitExceeded
            , expLimStr
        );
        // there seems nothing better to be done than to reset the entity expansion limit
        fEntityExpansionCount = 0;
    }

    firstCh = fEntityTable->get(bbName.getRawBuffer());
    escaped = true;
    return EntityExp_Returned;
}